

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall CConnman::StopNodes(CConnman *this)

{
  list<CNode_*,_std::allocator<CNode_*>_> *this_00;
  long lVar1;
  CNode *this_01;
  pointer ppCVar2;
  pointer ppCVar3;
  _List_node_base *p_Var4;
  long in_FS_OFFSET;
  vector<CAddress,_std::allocator<CAddress>_> anchors_to_dump;
  path local_80;
  vector<CNode_*,_std::allocator<CNode_*>_> nodes;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fAddressesInitialized == true) {
    DumpAddresses(this);
    this->fAddressesInitialized = false;
    if (this->m_use_addrman_outgoing == true) {
      GetCurrentBlockRelayOnlyConns(&anchors_to_dump,this);
      if (2 < (ulong)(((long)anchors_to_dump.super__Vector_base<CAddress,_std::allocator<CAddress>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)anchors_to_dump.super__Vector_base<CAddress,_std::allocator<CAddress>_>.
                            _M_impl.super__Vector_impl_data._M_start) / 0x38)) {
        std::vector<CAddress,_std::allocator<CAddress>_>::resize(&anchors_to_dump,2);
      }
      ArgsManager::GetDataDirNet((path *)&local_80,&gArgs);
      fs::operator/((path *)&nodes,(path *)&local_80,"anchors.dat");
      DumpAnchors((path *)&nodes,&anchors_to_dump);
      std::filesystem::__cxx11::path::~path((path *)&nodes);
      std::filesystem::__cxx11::path::~path(&local_80);
      std::vector<CAddress,_std::allocator<CAddress>_>::~vector(&anchors_to_dump);
    }
  }
  nodes.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  nodes.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  nodes.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&anchors_to_dump,
             &this->m_nodes_mutex,"m_nodes_mutex",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
             ,0xd73,false);
  std::_Vector_base<CNode_*,_std::allocator<CNode_*>_>::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&nodes,(_Vector_impl_data *)&this->m_nodes);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&anchors_to_dump);
  ppCVar2 = nodes.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar3 = nodes.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppCVar3 != ppCVar2; ppCVar3 = ppCVar3 + 1) {
    this_01 = *ppCVar3;
    CNode::CloseSocketDisconnect(this_01);
    DeleteNode(this,this_01);
  }
  this_00 = &this->m_nodes_disconnected;
  p_Var4 = (_List_node_base *)this_00;
  while (p_Var4 = (((_List_base<CNode_*,_std::allocator<CNode_*>_> *)&p_Var4->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, p_Var4 != (_List_node_base *)this_00) {
    DeleteNode(this,(CNode *)p_Var4[1]._M_next);
  }
  std::__cxx11::list<CNode_*,_std::allocator<CNode_*>_>::clear(this_00);
  std::vector<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>::clear
            (&this->vhListenSocket);
  std::__uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>::reset
            ((__uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_> *)&this->semOutbound,
             (pointer)0x0);
  std::__uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>::reset
            ((__uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_> *)&this->semAddnode,
             (pointer)0x0);
  std::_Vector_base<CNode_*,_std::allocator<CNode_*>_>::~_Vector_base
            (&nodes.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConnman::StopNodes()
{
    if (fAddressesInitialized) {
        DumpAddresses();
        fAddressesInitialized = false;

        if (m_use_addrman_outgoing) {
            // Anchor connections are only dumped during clean shutdown.
            std::vector<CAddress> anchors_to_dump = GetCurrentBlockRelayOnlyConns();
            if (anchors_to_dump.size() > MAX_BLOCK_RELAY_ONLY_ANCHORS) {
                anchors_to_dump.resize(MAX_BLOCK_RELAY_ONLY_ANCHORS);
            }
            DumpAnchors(gArgs.GetDataDirNet() / ANCHORS_DATABASE_FILENAME, anchors_to_dump);
        }
    }

    // Delete peer connections.
    std::vector<CNode*> nodes;
    WITH_LOCK(m_nodes_mutex, nodes.swap(m_nodes));
    for (CNode* pnode : nodes) {
        pnode->CloseSocketDisconnect();
        DeleteNode(pnode);
    }

    for (CNode* pnode : m_nodes_disconnected) {
        DeleteNode(pnode);
    }
    m_nodes_disconnected.clear();
    vhListenSocket.clear();
    semOutbound.reset();
    semAddnode.reset();
}